

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_10.hpp
# Opt level: O0

type * boost::phoenix::
       expr_ext<boost::phoenix::actor,_boost::phoenix::detail::tag::function_eval,_boost::spirit::terminal<boost::spirit::tag::big_word>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
       ::make(type *__return_storage_ptr__,param_type a0,param_type a1)

{
  param_type a1_local;
  param_type a0_local;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::big_word>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>
  *e;
  undefined1 local_90 [8];
  expr_type that;
  undefined4 uStack_40;
  
  that.child1.proto_expr_._8_8_ = a1;
  spirit::terminal<boost::spirit::tag::big_word>::terminal
            ((terminal<boost::spirit::tag::big_word> *)local_90,a0);
  that._0_8_ = *(undefined8 *)that.child1.proto_expr_._8_8_;
  uStack_40 = (undefined4)*(undefined8 *)(that.child1.proto_expr_._8_8_ + 8);
  that.child1.proto_expr_.child0.proto_expr_.child0.t_._0_4_ = uStack_40;
  proto::exprns_::
  basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::big_word>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>
  ::basic_expr(&__return_storage_ptr__->proto_expr_,
               (basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::big_word>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>
                *)local_90);
  return __return_storage_ptr__;
}

Assistant:

static type make(typename call_traits<A0>::param_type a0 , typename call_traits<A1>::param_type a1)
      { 
        
                actor<base_type> const e =
                {
                    proto::make_expr<
                        Tag
                      , phoenix_default_domain 
                    >(a0 , a1)
                };
            return e;
        }